

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChContactContainerSMC::GetContactableTorque
          (ChVector<double> *__return_storage_ptr__,ChContactContainerSMC *this,
          ChContactable *contactable)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  __hash_code __code;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  uVar1 = (this->contact_forces)._M_h._M_bucket_count;
  uVar3 = (ulong)contactable % uVar1;
  p_Var4 = (this->contact_forces)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4,
     (ChContactable *)p_Var4->_M_nxt[1]._M_nxt != contactable)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, (ChContactable *)p_Var2[1]._M_nxt == contactable)) goto LAB_0056f004;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0056f004:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
  }
  else {
    __return_storage_ptr__->m_data[0] = (double)p_Var2[5]._M_nxt;
    __return_storage_ptr__->m_data[1] = (double)p_Var2[6]._M_nxt;
    __return_storage_ptr__->m_data[2] = (double)p_Var2[7]._M_nxt;
  }
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChContactContainerSMC::GetContactableTorque(ChContactable* contactable) {
    std::unordered_map<ChContactable*, ForceTorque>::const_iterator Iterator = contact_forces.find(contactable);
    if (Iterator != contact_forces.end()) {
        return Iterator->second.torque;
    }
    return ChVector<>(0);
}